

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O2

size_t Imf_3_4::calculateBytesPerPixel(Header *header)

{
  int iVar1;
  ChannelList *this;
  const_iterator cVar2;
  ConstIterator CVar3;
  size_t sVar4;
  
  this = Header::channels(header);
  cVar2._M_node = (_Base_ptr)ChannelList::begin(this);
  sVar4 = 0;
  while( true ) {
    CVar3 = ChannelList::end(this);
    if ((const_iterator)cVar2._M_node == CVar3._i._M_node) break;
    iVar1 = pixelTypeSize(cVar2._M_node[9]._M_color);
    sVar4 = sVar4 + (long)iVar1;
    cVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar2._M_node);
  }
  return sVar4;
}

Assistant:

size_t
calculateBytesPerPixel (const Header& header)
{
    const ChannelList& channels = header.channels ();

    size_t bytesPerPixel = 0;

    for (ChannelList::ConstIterator c = channels.begin (); c != channels.end ();
         ++c)
    {
        bytesPerPixel += pixelTypeSize (c.channel ().type);
    }

    return bytesPerPixel;
}